

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaLf.c
# Opt level: O0

Gia_Man_t * Lf_ManDeriveMappingGia(Lf_Man_t *p)

{
  int iVar1;
  int iVar2;
  Vec_Int_t *p_00;
  Vec_Int_t *vMapping_00;
  Vec_Int_t *vMapping2_00;
  Vec_Int_t *vCover_00;
  Vec_Int_t *vLeaves_00;
  Gia_Man_t *pNew_00;
  char *pcVar3;
  Lf_Cut_t *pCut_00;
  bool bVar4;
  int local_54;
  int iLit;
  int i;
  Lf_Cut_t *pCut;
  Vec_Int_t *vLeaves;
  Vec_Int_t *vCover;
  Vec_Int_t *vMapping2;
  Vec_Int_t *vMapping;
  Vec_Int_t *vCopies;
  Gia_Obj_t *pObj;
  Gia_Man_t *pNew;
  Lf_Man_t *p_local;
  
  iVar1 = Gia_ManObjNum(p->pGia);
  p_00 = Vec_IntStartFull(iVar1);
  iVar1 = Gia_ManObjNum(p->pGia);
  vMapping_00 = Vec_IntStart(iVar1 * 2 + (int)p->pPars->Edge + (int)p->pPars->Area * 2 +
                             (int)p->pPars->Mux7 * 4);
  vMapping2_00 = Vec_IntStart((int)p->pPars->Edge + (int)p->pPars->Area * 2 + 1000);
  vCover_00 = Vec_IntAlloc(0x10000);
  vLeaves_00 = Vec_IntAlloc(0x10);
  if (p->pPars->fCutMin == 0) {
    __assert_fail("p->pPars->fCutMin",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaLf.c"
                  ,0x71c,"Gia_Man_t *Lf_ManDeriveMappingGia(Lf_Man_t *)");
  }
  iVar1 = Gia_ManObjNum(p->pGia);
  pNew_00 = Gia_ManStart(iVar1);
  pcVar3 = Abc_UtilStrsav(p->pGia->pName);
  pNew_00->pName = pcVar3;
  pcVar3 = Abc_UtilStrsav(p->pGia->pSpec);
  pNew_00->pSpec = pcVar3;
  Vec_IntWriteEntry(p_00,0,0);
  local_54 = 1;
  while( true ) {
    bVar4 = false;
    if (local_54 < p->pGia->nObjs) {
      vCopies = (Vec_Int_t *)Gia_ManObj(p->pGia,local_54);
      bVar4 = vCopies != (Vec_Int_t *)0x0;
    }
    if (!bVar4) break;
    iVar1 = Gia_ObjIsCi((Gia_Obj_t *)vCopies);
    if (iVar1 == 0) {
      iVar1 = Gia_ObjIsCo((Gia_Obj_t *)vCopies);
      if (iVar1 == 0) {
        iVar1 = Gia_ObjIsBuf((Gia_Obj_t *)vCopies);
        if (iVar1 == 0) {
          iVar1 = Lf_ObjMapRefNum(p,local_54);
          if (iVar1 != 0) {
            pCut_00 = Lf_ObjCutBest(p,local_54);
            if (pCut_00->iFunc < 0) {
              __assert_fail("pCut->iFunc >= 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaLf.c"
                            ,0x739,"Gia_Man_t *Lf_ManDeriveMappingGia(Lf_Man_t *)");
            }
            if (*(uint *)&pCut_00->field_0x14 >> 0x18 == 0) {
              iVar1 = Abc_Lit2Var(pCut_00->iFunc);
              if (iVar1 != 0) {
                __assert_fail("Abc_Lit2Var(pCut->iFunc) == 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaLf.c"
                              ,0x73c,"Gia_Man_t *Lf_ManDeriveMappingGia(Lf_Man_t *)");
              }
              Vec_IntWriteEntry(p_00,local_54,pCut_00->iFunc);
            }
            else if (*(uint *)&pCut_00->field_0x14 >> 0x18 == 1) {
              iVar1 = Abc_Lit2Var(pCut_00->iFunc);
              if (iVar1 != 1) {
                __assert_fail("Abc_Lit2Var(pCut->iFunc) == 1",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaLf.c"
                              ,0x742,"Gia_Man_t *Lf_ManDeriveMappingGia(Lf_Man_t *)");
              }
              iVar1 = Vec_IntEntry(p_00,(int)pCut_00[1].Sign);
              iVar2 = Abc_LitIsCompl(pCut_00->iFunc);
              iVar1 = Abc_LitNotCond(iVar1,iVar2);
              Vec_IntWriteEntry(p_00,local_54,iVar1);
            }
            else {
              iVar1 = Lf_ManDerivePart(p,pNew_00,vMapping_00,vMapping2_00,p_00,pCut_00,vLeaves_00,
                                       vCover_00,(Gia_Obj_t *)vCopies);
              iVar2 = Abc_LitIsCompl(pCut_00->iFunc);
              iVar1 = Abc_LitNotCond(iVar1,iVar2);
              Vec_IntWriteEntry(p_00,local_54,iVar1);
            }
          }
        }
        else {
          iVar1 = Gia_ObjFaninId0p(p->pGia,(Gia_Obj_t *)vCopies);
          iVar1 = Vec_IntEntry(p_00,iVar1);
          iVar2 = Gia_ObjFaninC0((Gia_Obj_t *)vCopies);
          iVar1 = Abc_LitNotCond(iVar1,iVar2);
          iVar1 = Gia_ManAppendBuf(pNew_00,iVar1);
          Vec_IntWriteEntry(p_00,local_54,iVar1);
        }
      }
      else {
        iVar1 = Gia_ObjFaninId0p(p->pGia,(Gia_Obj_t *)vCopies);
        iVar1 = Vec_IntEntry(p_00,iVar1);
        iVar2 = Gia_ObjFaninC0((Gia_Obj_t *)vCopies);
        iVar1 = Abc_LitNotCond(iVar1,iVar2);
        Gia_ManAppendCo(pNew_00,iVar1);
      }
    }
    else {
      iVar1 = Gia_ManAppendCi(pNew_00);
      Vec_IntWriteEntry(p_00,local_54,iVar1);
    }
    local_54 = local_54 + 1;
  }
  Vec_IntFree(p_00);
  Vec_IntFree(vCover_00);
  Vec_IntFree(vLeaves_00);
  iVar1 = Vec_IntSize(vMapping_00);
  iVar2 = Gia_ManObjNum(pNew_00);
  if (iVar2 < iVar1) {
    iVar1 = Gia_ManObjNum(pNew_00);
    Vec_IntShrink(vMapping_00,iVar1);
  }
  else {
    iVar1 = Gia_ManObjNum(pNew_00);
    Vec_IntFillExtra(vMapping_00,iVar1,0);
  }
  iVar1 = Vec_IntSize(vMapping_00);
  iVar2 = Gia_ManObjNum(pNew_00);
  if (iVar1 == iVar2) {
    for (local_54 = 0; iVar1 = Vec_IntSize(vMapping_00), local_54 < iVar1; local_54 = local_54 + 1)
    {
      iVar1 = Vec_IntEntry(vMapping_00,local_54);
      if (0 < iVar1) {
        iVar1 = Gia_ManObjNum(pNew_00);
        Vec_IntAddToEntry(vMapping_00,local_54,iVar1);
      }
    }
    Vec_IntAppend(vMapping_00,vMapping2_00);
    Vec_IntFree(vMapping2_00);
    if (pNew_00->vMapping == (Vec_Int_t *)0x0) {
      pNew_00->vMapping = vMapping_00;
      iVar1 = Gia_ManRegNum(p->pGia);
      Gia_ManSetRegNum(pNew_00,iVar1);
      return pNew_00;
    }
    __assert_fail("pNew->vMapping == NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaLf.c"
                  ,0x759,"Gia_Man_t *Lf_ManDeriveMappingGia(Lf_Man_t *)");
  }
  __assert_fail("Vec_IntSize(vMapping) == Gia_ManObjNum(pNew)",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaLf.c"
                ,0x752,"Gia_Man_t *Lf_ManDeriveMappingGia(Lf_Man_t *)");
}

Assistant:

Gia_Man_t * Lf_ManDeriveMappingGia( Lf_Man_t * p )
{
    Gia_Man_t * pNew; 
    Gia_Obj_t * pObj; 
    Vec_Int_t * vCopies   = Vec_IntStartFull( Gia_ManObjNum(p->pGia) );
    Vec_Int_t * vMapping  = Vec_IntStart( 2*Gia_ManObjNum(p->pGia) + (int)p->pPars->Edge + 2*(int)p->pPars->Area + 4*(int)p->pPars->Mux7 );
    Vec_Int_t * vMapping2 = Vec_IntStart( (int)p->pPars->Edge + 2*(int)p->pPars->Area + 1000 );
    Vec_Int_t * vCover    = Vec_IntAlloc( 1 << 16 );
    Vec_Int_t * vLeaves   = Vec_IntAlloc( 16 );
    Lf_Cut_t * pCut;
    int i, iLit; 
    assert( p->pPars->fCutMin );
    // create new manager
    pNew = Gia_ManStart( Gia_ManObjNum(p->pGia) );
    pNew->pName = Abc_UtilStrsav( p->pGia->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pGia->pSpec );
    Vec_IntWriteEntry( vCopies, 0, 0 );
    Gia_ManForEachObj1( p->pGia, pObj, i )
    {
        if ( Gia_ObjIsCi(pObj) )
        {
            Vec_IntWriteEntry( vCopies, i, Gia_ManAppendCi(pNew) );
            continue;
        }
        if ( Gia_ObjIsCo(pObj) )
        {
            iLit = Vec_IntEntry( vCopies, Gia_ObjFaninId0p(p->pGia, pObj) );
            iLit = Gia_ManAppendCo( pNew, Abc_LitNotCond(iLit, Gia_ObjFaninC0(pObj)) );
            continue;
        }
        if ( Gia_ObjIsBuf(pObj) )
        {
            iLit = Vec_IntEntry( vCopies, Gia_ObjFaninId0p(p->pGia, pObj) );
            iLit = Gia_ManAppendBuf( pNew, Abc_LitNotCond(iLit, Gia_ObjFaninC0(pObj)) );
            Vec_IntWriteEntry( vCopies, i, iLit );
            continue;
        }
        if ( !Lf_ObjMapRefNum(p, i) )
            continue;
        pCut = Lf_ObjCutBest( p, i );
        assert( pCut->iFunc >= 0 );
        if ( pCut->nLeaves == 0 )
        {
            assert( Abc_Lit2Var(pCut->iFunc) == 0 );
            Vec_IntWriteEntry( vCopies, i, pCut->iFunc );
            continue;
        }
        if ( pCut->nLeaves == 1 )
        {
            assert( Abc_Lit2Var(pCut->iFunc) == 1 );
            iLit = Vec_IntEntry( vCopies, pCut->pLeaves[0] );
            Vec_IntWriteEntry( vCopies, i, Abc_LitNotCond(iLit, Abc_LitIsCompl(pCut->iFunc)) );
            continue;
        }
        iLit = Lf_ManDerivePart( p, pNew, vMapping, vMapping2, vCopies, pCut, vLeaves, vCover, pObj );
        Vec_IntWriteEntry( vCopies, i, Abc_LitNotCond(iLit, Abc_LitIsCompl(pCut->iFunc)) );
    }
    Vec_IntFree( vCopies );
    Vec_IntFree( vCover );
    Vec_IntFree( vLeaves );
    // finish mapping 
    if ( Vec_IntSize(vMapping) > Gia_ManObjNum(pNew) )
        Vec_IntShrink( vMapping, Gia_ManObjNum(pNew) );
    else
        Vec_IntFillExtra( vMapping, Gia_ManObjNum(pNew), 0 );
    assert( Vec_IntSize(vMapping) == Gia_ManObjNum(pNew) );
    Vec_IntForEachEntry( vMapping, iLit, i )
        if ( iLit > 0 )
            Vec_IntAddToEntry( vMapping, i, Gia_ManObjNum(pNew) );
    Vec_IntAppend( vMapping, vMapping2 );
    Vec_IntFree( vMapping2 );
    // attach mapping and packing
    assert( pNew->vMapping == NULL );
    pNew->vMapping = vMapping;
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p->pGia) );
    return pNew;
}